

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  const_iterator cVar6;
  char *pcVar7;
  size_t sVar8;
  _Rb_tree_node_base *p_Var9;
  undefined8 extraout_RAX;
  _Rb_tree_header *p_Var10;
  ostream *poVar11;
  char *pcVar12;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  key_type local_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  uint local_8c;
  internal *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  pcVar12 = registered_tests + -1;
  local_8c = line;
  local_88 = (internal *)file;
  do {
    pbVar1 = (byte *)(pcVar12 + 1);
    pcVar12 = pcVar12 + 1;
    iVar3 = isspace((uint)*pbVar1);
  } while (iVar3 != 0);
  Message::Message((Message *)&local_98);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (_Rb_tree_node_base *)(this + 0x10);
  pcVar7 = pcVar12;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pcVar5 = strchr(pcVar7,0x2c);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_b8,pcVar7,(allocator *)&local_50);
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar7,pcVar5);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_80,&local_b8);
    p_Var10 = &local_80._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar6._M_node == p_Var10) {
      for (p_Var9 = *(_Rb_tree_node_base **)(this + 0x20); p_Var9 != p_Var2;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        iVar3 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar3 == 0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_80,&local_b8);
          goto LAB_00141446;
        }
      }
      poVar11 = (ostream *)(local_98.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"No test named ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," can be found in this test case.\n",0x21);
    }
    else {
      poVar11 = (ostream *)(local_98.ptr_ + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Test ",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," is listed more than once.\n",0x1b);
    }
LAB_00141446:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    pcVar7 = strchr(pcVar7,0x2c);
    iVar3 = (int)p_Var10;
    if (pcVar7 == (char *)0x0) {
      p_Var9 = *(_Rb_tree_node_base **)(this + 0x20);
      if (p_Var9 != p_Var2) {
        poVar11 = (ostream *)(local_98.ptr_ + 0x10);
        do {
          std::__cxx11::string::string
                    ((string *)&local_b8,*(char **)(p_Var9 + 1),(allocator *)&local_50);
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_80,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if ((_Rb_tree_header *)cVar6._M_node == &local_80._M_impl.super__Rb_tree_header) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"You forgot to list test ",0x18);
            pcVar7 = *(char **)(p_Var9 + 1);
            if (pcVar7 == (char *)0x0) {
              sVar8 = 6;
              pcVar7 = "(null)";
            }
            else {
              sVar8 = strlen(pcVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar7,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,".\n",2);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          iVar3 = (int)p_Var10;
        } while (p_Var9 != p_Var2);
      }
      StringStreamToString(&local_b8,local_98.ptr_);
      iVar4 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar4 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_80);
        if (local_98.ptr_ != (stringstream *)0x0) {
          (**(code **)(*(long *)local_98.ptr_ + 8))(local_98.ptr_);
        }
        return pcVar12;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_88,(char *)(ulong)local_8c,iVar3);
      VerifyRegisteredTestNames();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80);
      if (local_98.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_98.ptr_ + 8))(local_98.ptr_);
      }
      _Unwind_Resume(extraout_RAX);
    }
    do {
      pbVar1 = (byte *)(pcVar7 + 1);
      pcVar7 = pcVar7 + 1;
      iVar3 = isspace((uint)*pbVar1);
    } while (iVar3 != 0);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}